

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

vector<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_> * __thiscall
ary::BinaryPatternLocalizer::localize
          (vector<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_>
           *__return_storage_ptr__,BinaryPatternLocalizer *this,Mat *image)

{
  float fVar1;
  Size SVar2;
  char cVar3;
  uint id;
  void *pvVar4;
  undefined8 uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int in_R8D;
  Mat *pMVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  vector<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_> *localizations;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> polycont;
  int orientation;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> rotated;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  double confidence;
  CameraPosition camera;
  Mat contourMat;
  Mat rectifiedPatch;
  _InputArray local_2a8;
  vector<cv::Ptr<ary::Localization>,std::allocator<cv::Ptr<ary::Localization>>> *local_290;
  ulong *local_288;
  ulong *puStack_280;
  uchar *local_278;
  int local_264;
  uchar *local_260;
  MatAllocator *local_258;
  MatAllocator *local_250;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_248;
  PlanarLocalization *local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_220;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  local_218;
  Mat *local_200;
  double local_1f8;
  Size2f local_1f0;
  undefined1 local_1e8 [16];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_1d8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [8];
  Mat *pMStack_190;
  ulong *local_188;
  ulong *puStack_180;
  ulong *local_178;
  ulong *puStack_170;
  MatAllocator *local_168;
  UMatData *pUStack_160;
  MatSize local_158;
  size_t *local_150;
  size_t local_148 [2];
  undefined1 local_138 [8];
  undefined8 uStack_130;
  Size local_128;
  Size SStack_120;
  uchar *local_118;
  uchar *puStack_110;
  MatAllocator *local_108;
  UMatData *pUStack_100;
  MatSize local_f8;
  size_t *local_f0;
  size_t local_e8 [3];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> local_d0;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  uchar *local_80;
  
  local_290 = (vector<cv::Ptr<ary::Localization>,std::allocator<cv::Ptr<ary::Localization>>> *)
              __return_storage_ptr__;
  local_1d8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
  local_1d8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)&((BinaryPatternLocalizer *)
                 local_1d8.
                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start)->patterns;
  (((BinaryPatternLocalizer *)
   local_1d8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
   super__Vector_impl_data._M_start)->super_Localizer).super_CameraUser._vptr_CameraUser =
       (_func_int **)0x0;
  (((BinaryPatternLocalizer *)
   local_1d8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
   super__Vector_impl_data._M_start)->super_Localizer).super_CameraUser.camera.
  super_shared_ptr<ary::CameraModel>.
  super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (((BinaryPatternLocalizer *)
   local_1d8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
   super__Vector_impl_data._M_start)->super_Localizer).super_CameraUser.camera.
  super_shared_ptr<ary::CameraModel>.
  super___shared_ptr<ary::CameraModel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   &((BinaryPatternLocalizer *)
    local_1d8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
    super__Vector_impl_data._M_start)->block_size = 0;
  local_1d8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1d8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_260 = (uchar *)operator_new(0x20);
  local_258 = (MatAllocator *)(local_260 + 0x20);
  local_260[0x10] = '\0';
  local_260[0x11] = '\0';
  local_260[0x12] = '\0';
  local_260[0x13] = '\0';
  local_260[0x14] = '\0';
  local_260[0x15] = '\0';
  local_260[0x16] = '\0';
  local_260[0x17] = '\0';
  local_260[0x18] = '\0';
  local_260[0x19] = '\0';
  local_260[0x1a] = '\0';
  local_260[0x1b] = '\0';
  local_260[0x1c] = '\0';
  local_260[0x1d] = '\0';
  local_260[0x1e] = '\0';
  local_260[0x1f] = '\0';
  local_260[0] = '\0';
  local_260[1] = '\0';
  local_260[2] = '\0';
  local_260[3] = '\0';
  local_260[4] = '\0';
  local_260[5] = '\0';
  local_260[6] = '\0';
  local_260[7] = '\0';
  local_260[8] = '\0';
  local_260[9] = '\0';
  local_260[10] = '\0';
  local_260[0xb] = '\0';
  local_260[0xc] = '\0';
  local_260[0xd] = '\0';
  local_260[0xe] = '\0';
  local_260[0xf] = '\0';
  local_248.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_250 = local_258;
  local_248.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
  local_248.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((long)local_248.
                       super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + 0x20);
  *(int *)((long)local_248.
                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + 0x10) = 0;
  *(int *)((long)local_248.
                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + 0x14) = 0;
  *(int *)((long)local_248.
                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + 0x18) = 0;
  *(int *)((long)local_248.
                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + 0x1c) = 0;
  *(int *)((long)local_248.
                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + 0) = 0;
  *(int *)((long)local_248.
                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + 4) = 0;
  *(int *)((long)local_248.
                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + 8) = 0;
  *(int *)((long)local_248.
                 super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + 0xc) = 0;
  local_218.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278 = (uchar *)0x0;
  local_288 = (ulong *)0x0;
  puStack_280 = (ulong *)0x0;
  local_248.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_248.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((image->flags & 0xff8U) == 0x10) {
    local_80 = (uchar *)0x0;
    local_90._0_4_ = 0x1010000;
    uStack_130 = &this->grayImage;
    local_128.width = 0;
    local_128.height = 0;
    local_138._0_4_ = 0x2010000;
    local_90._8_8_ = image;
    cv::cvtColor((cv *)local_90,(_InputArray *)local_138,(_OutputArray *)0x6,0,in_R8D);
  }
  else {
    local_90._8_8_ = &this->grayImage;
    local_80 = (uchar *)0x0;
    local_90._0_4_ = 0x2010000;
    cv::Mat::copyTo((_OutputArray *)image);
  }
  local_200 = &this->grayImage;
  local_80 = (uchar *)0x0;
  local_90._0_4_ = 0x1010000;
  pMVar13 = &this->binImage;
  local_128.width = 0;
  local_128.height = 0;
  local_138._0_4_ = 0x2010000;
  uStack_130 = pMVar13;
  local_90._8_8_ = local_200;
  cv::adaptiveThreshold
            ((_InputArray *)local_90,(_OutputArray *)local_138,255.0,1,1,(int)this->block_size,
             (double)(int)this->threshold);
  local_188 = (ulong *)0x0;
  local_198._0_4_ = 0x1010000;
  local_2a8.sz.width = 0;
  local_2a8.sz.height = 0;
  local_2a8.flags = 0x2010000;
  local_2a8.obj = pMVar13;
  pMStack_190 = pMVar13;
  cv::Mat::Mat((Mat *)local_90);
  local_a8 = 0;
  local_b8._0_4_ = 0x1010000;
  local_98 = 0xffffffffffffffff;
  local_138._0_4_ = -1;
  local_138._4_4_ = 0x7fefffff;
  uStack_130 = (Mat *)0x7fefffffffffffff;
  local_128.width = -1;
  local_128.height = 0x7fefffff;
  SStack_120.width = -1;
  SStack_120.height = 0x7fefffff;
  local_b8._8_8_ = (Mat *)local_90;
  cv::dilate((Mat *)local_198,&local_2a8,local_b8,&local_98,1,0,local_138);
  cv::Mat::~Mat((Mat *)local_90);
  iVar11 = (this->binImage).cols + (this->binImage).rows;
  local_80 = (uchar *)0x0;
  local_90._0_4_ = 0x1010000;
  local_128.width = 0;
  local_128.height = 0;
  local_138._0_4_ = -0x7dfbfff4;
  uStack_130 = (Mat *)&local_218;
  local_a0 = 0;
  local_90._8_8_ = pMVar13;
  cv::findContours(local_90,local_138,1);
  cv::Mat::Mat((Mat *)local_90,100,100,0);
  *(undefined8 *)local_290 = 0;
  *(pointer *)(local_290 + 8) = (pointer)0x0;
  *(pointer *)(local_290 + 0x10) = (pointer)0x0;
  if (local_218.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_218.
      super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    iVar6 = iVar11 / 2;
    local_1b0 = (double)(iVar11 / 0xc);
    iVar11 = iVar6 * 4;
    local_1b8 = (double)iVar11;
    local_1c0 = (double)(iVar6 * iVar11);
    uVar12 = 0;
    pMVar13 = local_200;
    do {
      local_138._0_4_ = 0x42ff400c;
      local_138._4_4_ = 2;
      uVar7 = (long)local_218.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar12].
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_218.
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar12].
                    super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
                    super__Vector_impl_data._M_start;
      uStack_130 = (Mat *)CONCAT44(1,(int)(uVar7 >> 3));
      local_108 = (MatAllocator *)0x0;
      pUStack_100 = (UMatData *)0x0;
      puStack_110 = (uchar *)0x0;
      SStack_120.width = 0;
      SStack_120.height = 0;
      local_f0 = local_e8;
      local_e8[0] = 0;
      local_e8[1] = 0;
      SVar2 = *(Size *)(local_218.
                        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar12);
      if (SVar2 != (Size)local_218.
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar12].
                         super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish) {
        local_e8[1] = 8;
        local_e8[0] = 8;
        puStack_110 = (uchar *)(((long)(uVar7 * 0x20000000) >> 0x1d & 0xfffffffffffffff8U) +
                               (long)SVar2);
        SStack_120 = SVar2;
      }
      local_188 = (ulong *)0x0;
      local_198._0_4_ = 0x1010000;
      pMStack_190 = (Mat *)local_138;
      local_128 = SStack_120;
      local_118 = puStack_110;
      local_f8.p = (int *)&uStack_130;
      dVar14 = (double)cv::arcLength((_InputArray *)local_198,true);
      if ((local_1b0 < dVar14) && (dVar14 < local_1b8)) {
        if (puStack_280 != local_288) {
          puStack_280 = local_288;
        }
        local_188 = (ulong *)0x0;
        local_198._0_4_ = 0x1010000;
        local_2a8.sz.width = 0;
        local_2a8.sz.height = 0;
        local_2a8.flags = 0x8203000c;
        local_2a8.obj = &local_288;
        pMStack_190 = (Mat *)local_138;
        cv::approxPolyDP((_InputArray *)local_198,(_OutputArray *)&local_2a8,dVar14 * 0.02,true);
        if ((long)puStack_280 - (long)local_288 == 0x20) {
          local_198._0_4_ = 0x42ff400c;
          local_198._4_4_ = 2;
          pMStack_190 = (Mat *)0x100000004;
          local_158.p = (int *)&pMStack_190;
          local_168 = (MatAllocator *)0x0;
          pUStack_160 = (UMatData *)0x0;
          puStack_170 = (ulong *)0x0;
          puStack_180 = (ulong *)0x0;
          local_150 = local_148;
          local_148[0] = 0;
          local_148[1] = 0;
          if (local_288 != puStack_280) {
            local_148[1] = 8;
            local_148[0] = 8;
            puStack_180 = local_288;
            puStack_170 = local_288 + 4;
          }
          local_2a8.sz.width = 0;
          local_2a8.sz.height = 0;
          local_2a8.flags = 0x1010000;
          local_2a8.obj = (Mat *)local_198;
          local_188 = puStack_180;
          local_178 = puStack_170;
          cVar3 = cv::isContourConvex(&local_2a8);
          cv::Mat::~Mat((Mat *)local_198);
          if (cVar3 != '\0') {
            uVar7 = (long)puStack_280 - (long)local_288 >> 3;
            if (puStack_280 == local_288) goto LAB_001151a0;
            auVar15._8_8_ = 0;
            auVar15._0_8_ = *local_288;
            lVar8 = 1;
            auVar20 = auVar15;
            do {
              if (uVar7 + (uVar7 == 0) == lVar8) {
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
                uVar7 = extraout_RDX;
                goto LAB_00115158;
              }
              uVar10 = local_288[lVar8];
              auVar16._8_8_ = 0;
              auVar16._0_8_ = uVar10;
              auVar18._0_4_ = -(uint)((int)uVar10 < auVar20._0_4_);
              iVar11 = (int)(uVar10 >> 0x20);
              auVar18._4_4_ = -(uint)(iVar11 < auVar20._4_4_);
              auVar18._8_4_ = -(uint)(0 < auVar20._8_4_);
              auVar18._12_4_ = -(uint)(0 < auVar20._12_4_);
              auVar20 = ~auVar18 & auVar20 | auVar16 & auVar18;
              auVar19._0_4_ = -(uint)(auVar15._0_4_ < (int)uVar10);
              auVar19._4_4_ = -(uint)(auVar15._4_4_ < iVar11);
              auVar19._8_4_ = -(uint)(auVar15._8_4_ < 0);
              auVar19._12_4_ = -(uint)(auVar15._12_4_ < 0);
              auVar15 = ~auVar19 & auVar15 | auVar16 & auVar19;
              lVar8 = lVar8 + 1;
            } while (lVar8 != 4);
            local_b8._8_8_ =
                 CONCAT44((auVar15._4_4_ - auVar20._4_4_) + 1,(auVar15._0_4_ - auVar20._0_4_) + 1);
            local_b8._0_8_ = auVar20._0_8_;
            uVar10 = 0xffffffff;
            uVar9 = 0;
            dVar14 = local_1c0;
            do {
              if (uVar7 == uVar9) goto LAB_00115158;
              dVar17 = (double)*(int *)((long)local_288 + uVar9 * 8 + 4);
              dVar17 = SQRT((double)(int)local_288[uVar9] * (double)(int)local_288[uVar9] +
                            dVar17 * dVar17);
              if (dVar17 < dVar14) {
                uVar10 = uVar9 & 0xffffffff;
                dVar14 = dVar17;
              }
              uVar9 = uVar9 + 1;
            } while (uVar9 != 4);
            uVar9 = 0;
            do {
              local_1e8 = auVar20;
              if (uVar7 == uVar9) goto LAB_00115173;
              *(ulong *)(local_260 + uVar9 * 8) =
                   CONCAT44((float)(int)(local_288[uVar9] >> 0x20),(float)(int)local_288[uVar9]);
              uVar9 = uVar9 + 1;
            } while (uVar9 != 4);
            local_188 = (ulong *)0x0;
            local_198._0_4_ = 0x1010000;
            local_2a8.sz.width = 0;
            local_2a8.sz.height = 0;
            local_2a8.flags = 0x8303000d;
            local_2a8.obj = &local_260;
            local_1a0 = 0x300000003;
            local_1a8 = 0xffffffffffffffff;
            pMStack_190 = pMVar13;
            cv::cornerSubPix(0x3ff0000000000000,(Mat *)local_198,&local_2a8,&local_1a0,&local_1a8);
            iVar11 = (int)uVar10 + 4;
            lVar8 = 0;
            do {
              uVar7 = (ulong)(iVar11 % 4);
              if ((ulong)((long)local_258 - (long)local_260 >> 3) <= uVar7) goto LAB_00115184;
              fVar1 = *(float *)(local_260 + uVar7 * 8 + 4);
              *(float *)(&(((Localizer *)
                           &(local_1d8.
                             super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->x)->super_CameraUser).
                          _vptr_CameraUser + lVar8) =
                   *(float *)(local_260 + uVar7 * 8) - (float)(int)local_1e8._0_4_;
              *(float *)((long)&(((Localizer *)
                                 &(local_1d8.
                                   super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->x)->super_CameraUser)
                                ._vptr_CameraUser + lVar8 * 8 + 4) =
                   fVar1 - (float)(int)local_1e8._4_4_;
              lVar8 = lVar8 + 1;
              iVar11 = iVar11 + -1;
            } while (lVar8 != 4);
            rectifyPattern((BinaryPatternLocalizer *)
                           local_1d8.
                           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,pMVar13,&local_1d8,
                           (Rect *)local_b8,(Mat *)local_90);
            local_1f8 = 0.0;
            id = identifyPattern(this,(Mat *)local_90,&local_1f8,&local_264);
            if (-1 < (int)id) {
              iVar11 = ((int)uVar10 - local_264) + 8;
              lVar8 = 0;
              do {
                if ((ulong)((long)local_258 - (long)local_260 >> 3) <= (ulong)(long)(iVar11 % 4))
                goto LAB_00115192;
                *(undefined8 *)
                 ((long)local_248.
                        super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar8 * 2 * 4) =
                     *(undefined8 *)(local_260 + (long)(iVar11 % 4) * 8);
                lVar8 = lVar8 + 1;
                iVar11 = iVar11 + -1;
              } while (lVar8 != 4);
              calculateExtrinsics((CameraPosition *)local_198,this,
                                  (this->patterns).
                                  super__Vector_base<ary::BinaryPattern,_std::allocator<ary::BinaryPattern>_>
                                  ._M_impl.super__Vector_impl_data._M_start[id].size,&local_248);
              pvVar4 = operator_new(0x48);
              local_1e8._0_8_ = pvVar4;
              local_1f0.width =
                   (this->patterns).
                   super__Vector_base<ary::BinaryPattern,_std::allocator<ary::BinaryPattern>_>.
                   _M_impl.super__Vector_impl_data._M_start[id].size;
              local_1f0.height = local_1f0.width;
              std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                        (&local_d0,&local_248);
              uVar5 = local_1e8._0_8_;
              PlanarLocalization::PlanarLocalization
                        ((PlanarLocalization *)local_1e8._0_8_,id,(CameraPosition *)local_198,
                         &local_1f0,&local_d0,(float)local_1f8);
              local_228 = (PlanarLocalization *)uVar5;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<ary::PlanarLocalization*>(&_Stack_220,(PlanarLocalization *)uVar5);
              local_2a8._0_8_ = local_228;
              local_2a8.obj = _Stack_220._M_pi;
              local_228 = (PlanarLocalization *)0x0;
              _Stack_220._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              std::vector<cv::Ptr<ary::Localization>,std::allocator<cv::Ptr<ary::Localization>>>::
              emplace_back<cv::Ptr<ary::Localization>>
                        (local_290,(Ptr<ary::Localization> *)&local_2a8);
              pMVar13 = local_200;
              if ((Mat *)local_2a8.obj != (Mat *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8.obj);
              }
              if ((Mat *)_Stack_220._M_pi != (Mat *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_220._M_pi);
              }
              if (local_d0.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_d0.
                                super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
              }
            }
          }
        }
      }
      cv::Mat::~Mat((Mat *)local_138);
      uVar12 = (ulong)((int)uVar12 + 1);
      uVar7 = ((long)local_218.
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_218.
                     super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar12 <= uVar7 && uVar7 - uVar12 != 0);
  }
  cv::Mat::~Mat((Mat *)local_90);
  if (local_288 != (ulong *)0x0) {
    operator_delete(local_288);
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_218);
  if (local_248.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_260 != (uchar *)0x0) {
    operator_delete(local_260);
  }
  if ((BinaryPatternLocalizer *)
      local_1d8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (BinaryPatternLocalizer *)0x0) {
    operator_delete(local_1d8.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (vector<cv::Ptr<ary::Localization>,_std::allocator<cv::Ptr<ary::Localization>_>_> *)
         local_290;
LAB_00115158:
  uVar12 = 3;
  if (uVar7 < 3) {
    uVar12 = uVar7;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar12);
  uVar7 = extraout_RDX_00;
LAB_00115173:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7);
LAB_00115184:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00115192:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_001151a0:
  uVar5 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0);
  if (local_288 != (ulong *)0x0) {
    operator_delete(local_288);
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector(&local_218);
  if (local_248.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_260 != (uchar *)0x0) {
    operator_delete(local_260);
  }
  if ((BinaryPatternLocalizer *)
      local_1d8.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (BinaryPatternLocalizer *)0x0) {
    operator_delete(local_1d8.
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  _Unwind_Resume(uVar5);
}

Assistant:

vector<SharedLocalization> BinaryPatternLocalizer::localize(const Mat& image) {

	vector<Point2f> roi(4);
	vector<Point2f> refined(4);
    vector<Point2f> rotated(4);

	vector<vector<Point> > contours;
	vector<Point> polycont;

    //binarize image
    if (image.channels() == 3) {
	    cvtColor(image, grayImage, COLOR_BGR2GRAY);
    }
    else {
	    image.copyTo(grayImage);
    }

    adaptiveThreshold(grayImage, binImage, 255, ADAPTIVE_THRESH_GAUSSIAN_C, THRESH_BINARY_INV, block_size, (int) threshold);
    dilate(binImage, binImage, Mat());

	int avsize = (binImage.rows + binImage.cols) / 2;

	//find contours in binary image
	cv::findContours(binImage, contours, RETR_LIST, CHAIN_APPROX_SIMPLE);

	unsigned int i;
	Point p;
	int pMinX, pMinY, pMaxY, pMaxX;
    Mat rectifiedPatch(PATTERN_SIZE, PATTERN_SIZE, CV_8UC1);;

    vector<SharedLocalization> localizations;

	for (i = 0; i < contours.size(); i++) {
		Mat contourMat = Mat (contours[i]);
		const double per = arcLength( contourMat, true);
		//check the perimeter

		if (per > (avsize / 6) && per < (4 * avsize)) {

			polycont.clear();
			approxPolyDP( contourMat, polycont, per * 0.02, true);
			//check rectangularity and convexity
			if (polycont.size() == 4 && isContourConvex(Mat (polycont))) {

				//locate the 2D box of contour,
				p = polycont.at(0);
				pMinX = pMaxX = p.x;
				pMinY = pMaxY = p.y;
				int j;
				for (j = 1; j < 4; j++) {
					p = polycont.at(j);
					if (p.x < pMinX) {
						pMinX = p.x;
					}
					if (p.x > pMaxX) {
						pMaxX = p.x;
					}
					if (p.y < pMinY) {
						pMinY = p.y;
					}
					if (p.y > pMaxY) {
						pMaxY = p.y;
					}
				}
				Rect box(pMinX, pMinY, pMaxX - pMinX + 1, pMaxY - pMinY + 1);

				//find the upper left vertex
				double d;
				double dmin = (4 * avsize * avsize);
				int v1 = -1;
				for (j = 0; j < 4; j++) {
					d = norm(polycont.at(j));
					if (d < dmin) {
						dmin = d;
						v1 = j;
					}
				}

				//store vertices in refinedVertices and enable sub-pixel refinement if you want
				for (j = 0; j < 4; j++) {
					refined[j] = polycont.at(j);
				}

				//refine corners
				cornerSubPix(grayImage, refined, Size(3, 3), Size(-1, -1), TermCriteria(1, 3, 1));

				//rotate vertices based on upper left vertex; this gives you the most trivial homogrpahy
				for (j = 0; j < 4; j++) {
					roi[j] = Point2f(refined.at((4 + v1 - j) % 4).x - pMinX, refined.at((4 + v1 - j) % 4).y - pMinY);
				}

	            //rectify the candidate pattern (find homography and warp the ROI)
	            rectifyPattern(grayImage, roi, box, rectifiedPatch);

	            double confidence = 0;
	            int orientation;

	            int id = identifyPattern(rectifiedPatch, confidence, orientation);
	            //push-back pattern in the stack of foundPatterns and find its extrinsics

	            if (id >= 0) {

		            for (j = 0; j < 4; j++) {
			            rotated[j] = refined.at((8 - orientation + v1 - j) % 4);
		            }

		            //find the transformation (from camera CS to pattern CS)
		            CameraPosition camera = calculateExtrinsics(patterns[id].getSize(), rotated);
		            localizations.push_back(Ptr<PlanarLocalization>(new PlanarLocalization(id, camera, Size2f(patterns[id].getSize(), patterns[id].getSize()), rotated, (float) confidence)));

	            }


			}
		}
	}

    return localizations;
}